

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Neuron.cpp
# Opt level: O1

void __thiscall
Neuron::Neuron(Neuron *this,float extI,float expireSpeedFired,float expireSpeedNotFired)

{
  this->m_extI = extI;
  this->m_expireSpeedFired = expireSpeedFired;
  this->m_expireSpeedNotFired = expireSpeedNotFired;
  this->m_prevMem = -60.0;
  this->m_curMem = -60.0;
  (this->m_watchFor).
  super__Vector_base<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_watchFor).
  super__Vector_base<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_watchFor).
  super__Vector_base<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_synI = 0.0;
  this->m_prevAdd = 0.0;
  *(undefined8 *)&this->m_curAdd = 0;
  *(undefined8 *)
   ((long)&(this->m_connections).super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl
           .super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_connections).super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl
           .super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_connections).super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_incomingSpikes).super__Vector_base<Connection_*,_std::allocator<Connection_*>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_incomingSpikes).super__Vector_base<Connection_*,_std::allocator<Connection_*>_>.
           _M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->m_incomingSpikes).super__Vector_base<Connection_*,_std::allocator<Connection_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  return;
}

Assistant:

Neuron::Neuron(float extI, float expireSpeedFired, float expireSpeedNotFired)
    : m_extI(extI)
    , m_expireSpeedFired(expireSpeedFired)
    , m_expireSpeedNotFired(expireSpeedNotFired)
    , m_prevMem(kDefaultMembrane)
    , m_curMem(kDefaultMembrane)
{
}